

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMaxDown
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *dispatcher,bool updateOverlaps)

{
  short *psVar1;
  btOverlappingPairCallback *pbVar2;
  long lVar3;
  bool bVar4;
  Edge EVar5;
  long lVar6;
  undefined6 in_register_00000012;
  Handle *pHandleA;
  uint axis0;
  long lVar7;
  unsigned_short *puVar8;
  Edge *pEVar9;
  Handle *handle1;
  Handle *pHandleB;
  
  lVar7 = (long)axis;
  pEVar9 = this->m_pEdges[lVar7] + (CONCAT62(in_register_00000012,edge) & 0xffffffff);
  axis0 = 1 << ((byte)axis & 0x1f) & 3;
  puVar8 = this->m_pHandles[pEVar9->m_handle].m_maxEdges + lVar7;
  EVar5.m_handle = 0;
  EVar5.m_pos = pEVar9->m_pos;
  lVar3 = 0x3c;
  for (; EVar5.m_pos < pEVar9[-1].m_pos; pEVar9 = pEVar9 + -1) {
    pHandleB = this->m_pHandles + pEVar9[-1].m_handle;
    lVar6 = 0x42;
    if (((pEVar9[-1].m_pos & 1) == 0) && (lVar6 = lVar3, updateOverlaps)) {
      pHandleA = this->m_pHandles + pEVar9->m_handle;
      bVar4 = testOverlap2D(this,pHandleA,pHandleB,axis0,1 << (sbyte)axis0 & 3);
      if (bVar4) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[3])
                  (this->m_pairCache,pHandleA,pHandleB,dispatcher);
        pbVar2 = this->m_userPairCallback;
        if (pbVar2 != (btOverlappingPairCallback *)0x0) {
          (*pbVar2->_vptr_btOverlappingPairCallback[3])(pbVar2,pHandleA,pHandleB,dispatcher);
        }
      }
    }
    psVar1 = (short *)((long)(pHandleB->super_btBroadphaseProxy).m_aabbMin.m_floats +
                      lVar7 * 2 + lVar6 + -0x1c);
    *psVar1 = *psVar1 + 1;
    *puVar8 = *puVar8 - 1;
    EVar5 = *pEVar9;
    *pEVar9 = pEVar9[-1];
    pEVar9[-1] = EVar5;
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxDown(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{

	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (!pPrev->IsMax())
		{
			// if previous edge was a minimum remove any overlap between the two handles
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pPrev->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;

			if (updateOverlaps  
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				//this is done during the overlappingpairarray iteration/narrowphase collision

				
				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
			


			}

			// update edge reference in other handle
			pHandlePrev->m_minEdges[axis]++;;
		}
		else
			pHandlePrev->m_maxEdges[axis]++;

		pHandleEdge->m_maxEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}